

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  bool bVar1;
  date_t dVar2;
  int64_t bucket_width_micros;
  timestamp_t tVar3;
  int64_t ts_micros;
  interval_t iVar4;
  interval_t local_38;
  
  local_38.micros = bucket_width.micros;
  local_38._0_8_ = bucket_width._0_8_;
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(ts);
  if (bVar1) {
    bucket_width_micros = duckdb::Interval::GetMicro(&local_38);
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(ts);
    iVar4 = (interval_t)duckdb::Interval::Invert(offset);
    tVar3.value = duckdb::Interval::Add(tVar3,iVar4);
    ts_micros = duckdb::Timestamp::GetEpochMicroSeconds(tVar3);
    tVar3 = WidthConvertibleToMicrosCommon(bucket_width_micros,ts_micros,0x35d2976e6a000);
    tVar3.value = duckdb::Interval::Add(tVar3,offset);
    dVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar3);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(ts);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(
			    Interval::Add(Cast::template Operation<TB, timestamp_t>(ts), Interval::Invert(offset)));
			return Cast::template Operation<timestamp_t, TR>(Interval::Add(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS), offset));
		}